

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_> __thiscall
cs222::Parser::next(Parser *this)

{
  string *this_00;
  bool bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  Format FVar4;
  int iVar5;
  istream *piVar6;
  ulong uVar7;
  char *pcVar8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var9;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  difference_type dVar10;
  const_reference this_01;
  pointer pvVar11;
  Parser *in_RSI;
  bool local_4c2;
  bool local_489;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>,_true>
  local_458;
  Format local_44c;
  undefined1 local_448 [4];
  Format fmt_1;
  Operand_pair temp;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_3d8;
  undefined1 local_3b8 [8];
  smatch match;
  size_t first_non_space;
  undefined1 local_330 [16];
  streamoff local_320;
  size_t lookahead_start;
  string lookahead;
  Format fmt;
  bitset<6UL> local_2c8;
  string comment;
  Operand_pair operands;
  string operandsToken;
  string operation;
  string label;
  undefined1 local_1f0 [8];
  string token;
  stringstream sstream;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_38;
  Parser *this_local;
  
  this_local = this;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&in_RSI->nextInstruction);
  if (bVar1) {
    std::unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_>::unique_ptr
              ((unique_ptr<cs222::Instruction,_std::default_delete<cs222::Instruction>_> *)this,
               &in_RSI->nextInstruction);
    return (__uniq_ptr_data<cs222::Instruction,_std::default_delete<cs222::Instruction>,_true,_true>
           )(__uniq_ptr_data<cs222::Instruction,_std::default_delete<cs222::Instruction>,_true,_true>
             )this;
  }
  piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                     (in_RSI->inputStream,(string *)&in_RSI->line);
  bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18)));
  if (!bVar1) {
    std::unique_ptr<cs222::Instruction,std::default_delete<cs222::Instruction>>::
    unique_ptr<std::default_delete<cs222::Instruction>,void>
              ((unique_ptr<cs222::Instruction,std::default_delete<cs222::Instruction>> *)this,
               (nullptr_t)0x0);
    return (__uniq_ptr_data<cs222::Instruction,_std::default_delete<cs222::Instruction>,_true,_true>
           )(__uniq_ptr_data<cs222::Instruction,_std::default_delete<cs222::Instruction>,_true,_true>
             )this;
  }
  in_RSI->lineNumber = in_RSI->lineNumber + 1;
  std::bitset<6UL>::reset(&in_RSI->flags);
  do {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&local_38,"^\\s*$",0x10);
    bVar1 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,char,std::__cxx11::regex_traits<char>>
                      (&in_RSI->line,&local_38,0);
    local_489 = false;
    if (bVar1) {
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (in_RSI->inputStream,(string *)&in_RSI->line);
      local_489 = std::ios::operator_cast_to_bool
                            ((ios *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18)));
    }
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_38);
  } while (local_489 != false);
  uVar7 = std::ios::operator!((ios *)(in_RSI->inputStream +
                                     *(long *)(*(long *)in_RSI->inputStream + -0x18)));
  if ((uVar7 & 1) != 0) {
    std::unique_ptr<cs222::Instruction,std::default_delete<cs222::Instruction>>::
    unique_ptr<std::default_delete<cs222::Instruction>,void>
              ((unique_ptr<cs222::Instruction,std::default_delete<cs222::Instruction>> *)this,
               (nullptr_t)0x0);
    return (__uniq_ptr_data<cs222::Instruction,_std::default_delete<cs222::Instruction>,_true,_true>
           )(__uniq_ptr_data<cs222::Instruction,_std::default_delete<cs222::Instruction>,_true,_true>
             )this;
  }
  _Var3 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream
            ((stringstream *)(token.field_2._M_local_buf + 8),(string *)&in_RSI->line,_Var3);
  std::__cxx11::string::string((string *)local_1f0);
  advanceToken((stringstream *)(token.field_2._M_local_buf + 8),(string *)local_1f0);
  pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)local_1f0);
  if (*pcVar8 == '.') {
    std::make_unique<cs222::Instruction,unsigned_long&,std::__cxx11::string&>
              ((unsigned_long *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &in_RSI->lineNumber);
    goto LAB_00131854;
  }
  std::__cxx11::string::string((string *)(operation.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(operandsToken.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(operands.second.value.field_2._M_local_buf + 8));
  std::pair<cs222::Operand,_cs222::Operand>::pair<cs222::Operand,_cs222::Operand,_true>
            ((pair<cs222::Operand,_cs222::Operand> *)((long)&comment.field_2 + 8));
  std::__cxx11::string::string((string *)&local_2c8);
  bVar1 = false;
  bVar2 = isDirective((string *)local_1f0);
  local_4c2 = true;
  if (!bVar2) {
    bVar2 = isOperation((string *)local_1f0);
    local_4c2 = true;
    if (!bVar2) {
      std::__cxx11::string::substr((ulong)&fmt,(ulong)local_1f0);
      bVar1 = true;
      local_4c2 = isOperation((string *)&fmt);
    }
  }
  if (bVar1) {
    std::__cxx11::string::~string((string *)&fmt);
  }
  if (((local_4c2 ^ 0xffU) & 1) != 0) {
    parseLabel(in_RSI,(string *)local_1f0,(string *)((long)&operation.field_2 + 8));
    advanceToken((stringstream *)(token.field_2._M_local_buf + 8),(string *)local_1f0);
  }
  parseOperation(in_RSI,(string *)local_1f0,(string *)((long)&operandsToken.field_2 + 8));
  bVar1 = isOperation((string *)((long)&operandsToken.field_2 + 8));
  if (bVar1) {
    lookahead.field_2._8_8_ =
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>_>_>
         ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>_>_>
                 *)OpTable_abi_cxx11_,(key_type *)((long)&operandsToken.field_2 + 8));
    pvVar11 = std::__detail::
              _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>,_false,_true>
              ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>,_false,_true>
                            *)((long)&lookahead.field_2 + 8));
    FVar4 = Operation::getValidFormat(&pvVar11->second);
    if ((FVar4 != FORMAT_1) &&
       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )((long)&operandsToken.field_2 + 8),"RSUB"), !bVar1))
    goto LAB_00131249;
    advanceToken((stringstream *)(token.field_2._M_local_buf + 8),(string *)local_1f0);
    std::__cxx11::string::operator=((string *)&local_2c8,(string *)local_1f0);
    flushRestToToken((stringstream *)(token.field_2._M_local_buf + 8),(string *)local_1f0);
    std::__cxx11::string::operator+=((string *)&local_2c8,(string *)local_1f0);
    std::
    make_unique<cs222::Instruction,unsigned_long&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,cs222::Operand&,cs222::Operand&,std::__cxx11::string&,std::__cxx11::string&,std::bitset<6ul>&>
              ((unsigned_long *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &in_RSI->lineNumber,&in_RSI->line,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&operation.field_2 + 8),(Operand *)((long)&operandsToken.field_2 + 8),
               (Operand *)((long)&comment.field_2 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&operands.first.value.field_2 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&operands.second.value.field_2 + 8),&local_2c8);
  }
  else {
LAB_00131249:
    std::__cxx11::string::string((string *)&lookahead_start);
    local_330 = std::istream::tellg();
    local_320 = std::fpos::operator_cast_to_long((fpos *)local_330);
    if (local_320 != -1) {
      std::__cxx11::string::substr((ulong)&first_non_space,(ulong)&in_RSI->line);
      std::__cxx11::string::operator=((string *)&lookahead_start,(string *)&first_non_space);
      std::__cxx11::string::~string((string *)&first_non_space);
    }
    __first._M_current = (char *)std::__cxx11::string::begin();
    _Var9._M_current = (char *)std::__cxx11::string::begin();
    __last._M_current = (char *)std::__cxx11::string::end();
    _Var9 = std::find_if_not<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
                      (_Var9,__last,isspace);
    dVar10 = std::distance<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>(__first,_Var9);
    std::__cxx11::string::substr((ulong)&match._M_begin,(ulong)&lookahead_start);
    std::__cxx11::string::operator=((string *)&lookahead_start,(string *)&match._M_begin);
    std::__cxx11::string::~string((string *)&match._M_begin);
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     *)local_3b8);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&local_3d8,"^\\=?C\'[A-Za-z0-9\\s]+\'",0x10);
    bVar1 = std::
            regex_match<std::char_traits<char>,std::allocator<char>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &lookahead_start,
                       (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)local_3b8,&local_3d8,0);
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_3d8);
    if (bVar1) {
      this_01 = std::__cxx11::
                match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::operator[]((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                              *)local_3b8,0);
      std::__cxx11::sub_match::operator_cast_to_string
                ((string_type *)((long)&temp.second.value.field_2 + 8),(sub_match *)this_01);
      this_00 = (string *)(temp.second.value.field_2._M_local_buf + 8);
      std::__cxx11::string::operator=((string *)local_1f0,this_00);
      std::__cxx11::string::~string(this_00);
      iVar5 = std::__cxx11::string::length();
      std::istream::seekg((long)((long)&token.field_2 + 8),(int)dVar10 + iVar5);
    }
    else {
      advanceToken((stringstream *)(token.field_2._M_local_buf + 8),(string *)local_1f0);
    }
    std::pair<cs222::Operand,_cs222::Operand>::pair<cs222::Operand,_cs222::Operand,_true>
              ((pair<cs222::Operand,_cs222::Operand> *)local_448);
    bVar1 = parseOperands(in_RSI,(string *)local_1f0,(Operand_pair *)local_448);
    if (bVar1) {
      std::__cxx11::string::operator=
                ((string *)(operands.second.value.field_2._M_local_buf + 8),(string *)local_1f0);
      std::pair<cs222::Operand,_cs222::Operand>::operator=
                ((pair<cs222::Operand,_cs222::Operand> *)((long)&comment.field_2 + 8),
                 (type)local_448);
      bVar1 = isOperation((string *)((long)&operandsToken.field_2 + 8));
      if (bVar1) {
        local_458._M_cur =
             (__node_type *)
             std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>_>_>
             ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>_>_>
                     *)OpTable_abi_cxx11_,(key_type *)((long)&operandsToken.field_2 + 8));
        pvVar11 = std::__detail::
                  _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>,_false,_true>
                  ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs222::Operation>,_false,_true>
                                *)&local_458);
        local_44c = Operation::getValidFormat(&pvVar11->second);
        if (local_44c == FORMAT_3_4) {
          bVar1 = std::bitset<6UL>::test(&in_RSI->flags,5);
          if (!bVar1) {
            bVar1 = std::bitset<6UL>::test(&in_RSI->flags,4);
            if (!bVar1) {
              std::bitset<6UL>::set(&in_RSI->flags,5,true);
              std::bitset<6UL>::set(&in_RSI->flags,4,true);
            }
          }
        }
      }
      advanceToken((stringstream *)(token.field_2._M_local_buf + 8),(string *)local_1f0);
    }
    std::__cxx11::string::operator=((string *)&local_2c8,(string *)local_1f0);
    flushRestToToken((stringstream *)(token.field_2._M_local_buf + 8),(string *)local_1f0);
    std::__cxx11::string::operator+=((string *)&local_2c8,(string *)local_1f0);
    std::
    make_unique<cs222::Instruction,unsigned_long&,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&,cs222::Operand&,cs222::Operand&,std::__cxx11::string&,std::__cxx11::string&,std::bitset<6ul>&>
              ((unsigned_long *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &in_RSI->lineNumber,&in_RSI->line,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&operation.field_2 + 8),(Operand *)((long)&operandsToken.field_2 + 8),
               (Operand *)((long)&comment.field_2 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&operands.first.value.field_2 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&operands.second.value.field_2 + 8),&local_2c8);
    std::pair<cs222::Operand,_cs222::Operand>::~pair
              ((pair<cs222::Operand,_cs222::Operand> *)local_448);
    std::__cxx11::
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~match_results((match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)local_3b8);
    std::__cxx11::string::~string((string *)&lookahead_start);
  }
  std::__cxx11::string::~string((string *)&local_2c8);
  std::pair<cs222::Operand,_cs222::Operand>::~pair
            ((pair<cs222::Operand,_cs222::Operand> *)((long)&comment.field_2 + 8));
  std::__cxx11::string::~string((string *)(operands.second.value.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(operandsToken.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(operation.field_2._M_local_buf + 8));
LAB_00131854:
  std::__cxx11::string::~string((string *)local_1f0);
  std::__cxx11::stringstream::~stringstream((stringstream *)(token.field_2._M_local_buf + 8));
  return (__uniq_ptr_data<cs222::Instruction,_std::default_delete<cs222::Instruction>,_true,_true>)
         (__uniq_ptr_data<cs222::Instruction,_std::default_delete<cs222::Instruction>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<Instruction> Parser::next()
    {
        if (nextInstruction) {
            return std::move(nextInstruction);
        }

        if (std::getline(inputStream, line))
        {
            lineNumber += 1;
            flags.reset();

            // Ignore empty lines
            while (
                    std::regex_match(line, std::regex("^\\s*$")) &&
                    std::getline(inputStream, line)
                    );

            // Reached end of stream?
            if (!inputStream)
            {
                return nullptr;
            }

            std::stringstream sstream(line);
            std::string token;

            advanceToken(sstream, token);
            if (token[0] == '.') // Comment line?
            {
                return std::make_unique<Instruction>(lineNumber, line);
            }

            std::string label;
            std::string operation;
            std::string operandsToken;
            Operand_pair operands;
            std::string comment;

            if (!(
                        isDirective(token) ||
                        isOperation(token) ||
                        isOperation(token.substr(1))))
            {
                parseLabel(token, label);
                advanceToken(sstream, token);
            }

            parseOperation(token, operation);

            if (isOperation(operation))
            {
                Instruction::Format fmt =
                    OpTable.find(operation)->second.getValidFormat();
                if (fmt == Instruction::FORMAT_1 || operation == "RSUB")
                {
                    advanceToken(sstream, token);
                    comment = token;
                    flushRestToToken(sstream, token);
                    comment += token;
                    return std::make_unique<Instruction>(
                            lineNumber, line, label, operation,
                            operands.first, operands.second,
                            operandsToken, comment, flags);
                }
            }

            // Corner case: character constants
            // and literals can have spaces
            std::string lookahead;
            size_t lookahead_start = sstream.tellg();
            if (lookahead_start != -1)
            {
                lookahead = line.substr(lookahead_start);
            }
            size_t first_non_space = std::distance(
                    lookahead.begin(),
                    find_if_not(lookahead.begin(), lookahead.end(), isspace));
            lookahead = lookahead.substr(first_non_space);
            std::smatch match;
            if (std::regex_match(
                        lookahead,
                        match,
                        std::regex("^\\=?C'[A-Za-z0-9\\s]+'")))
            {
                token = match[0];
                sstream.seekg(
                        first_non_space + token.length(), std::ios_base::cur);
            }
            else
            {
                advanceToken(sstream, token);
            }

            Operand_pair temp;
            if (parseOperands(token, temp))
            {
                operandsToken = token;
                operands = temp;
                // SIC/XE Simple Addressing
                if (isOperation(operation))
                    {
                    Instruction::Format fmt =
                        cs222::OpTable.find(operation)->second.getValidFormat();
                    if (fmt == Instruction::FORMAT_3_4 && !(
                                flags.test(Instruction::FLAG_INDIRECT) ||
                                flags.test(Instruction::FLAG_IMMEDIATE)))
                    {
                        flags.set(Instruction::FLAG_INDIRECT);
                        flags.set(Instruction::FLAG_IMMEDIATE);
                    }
                }
                advanceToken(sstream, token);
            }

            comment = token;
            flushRestToToken(sstream, token);
            comment += token;

            return std::make_unique<Instruction>(
                    lineNumber, line, label, operation,
                    operands.first, operands.second,
                    operandsToken, comment, flags);
        }

        return nullptr;
    }